

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cpp
# Opt level: O2

void __thiscall Kernel::Signature::Symbol::addColor(Symbol *this,Color color)

{
  UserErrorException *this_00;
  Color CVar1;
  
  CVar1 = *(uint *)&this->field_0x40 >> 8 & COLOR_INVALID;
  if (CVar1 == color || CVar1 == COLOR_TRANSPARENT) {
    *(Color *)&this->field_0x40 =
         *(uint *)&this->field_0x40 & 0xfffffcff | (color & COLOR_INVALID) << 8;
    return;
  }
  this_00 = (UserErrorException *)__cxa_allocate_exception(0x50);
  Lib::UserErrorException::Exception(this_00,"A symbol cannot have two colors");
  __cxa_throw(this_00,&Lib::UserErrorException::typeinfo,
              Lib::UserErrorException::~UserErrorException);
}

Assistant:

void Signature::Symbol::addColor(Color color)
{
  ASS_L(color,3);
  ASS_G(color,0);
  ASS(env.colorUsed);

  if (_color && color != static_cast<Color>(_color)) {
    USER_ERROR("A symbol cannot have two colors");
  }
  _color = color;
}